

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

int __thiscall Assimp::B3DImporter::ReadByte(B3DImporter *this)

{
  uint uVar1;
  size_type sVar2;
  byte *pbVar3;
  allocator<char> local_31;
  string local_30;
  B3DImporter *local_10;
  B3DImporter *this_local;
  
  uVar1 = this->_pos;
  local_10 = this;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buf);
  if (uVar1 < sVar2) {
    uVar1 = this->_pos;
    this->_pos = uVar1 + 1;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_buf,(ulong)uVar1);
    return (int)*pbVar3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"EOF",&local_31);
  Fail(this,&local_30);
}

Assistant:

int B3DImporter::ReadByte(){
    if( _pos<_buf.size() ) {
        return _buf[_pos++];
    }
    
    Fail( "EOF" );
    return 0;
}